

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-json.c
# Opt level: O0

void test_bson_as_json_x1000(void)

{
  byte bVar1;
  undefined8 uVar2;
  time_t tVar3;
  ulong uVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 local_51;
  undefined1 local_4d;
  uint8_t uStack_4c;
  uint8_t uStack_4b;
  uint8_t uStack_4a;
  uint8_t binary [5];
  int i;
  size_t len;
  char *str;
  bson_t *b2;
  bson_t *b;
  bson_decimal128_t decimal128;
  bson_oid_t oid;
  
  decimal128.low = 0x3040000000000000;
  b = (bson_t *)0xb;
  bson_oid_init_from_string((undefined1 *)((long)&decimal128.high + 4),"123412341234abcdabcdabcd");
  uVar2 = bson_new();
  bVar1 = bson_append_utf8(uVar2,"utf8",0xffffffff,"bar");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x74,"test_bson_as_json_x1000","bson_append_utf8 (b, \"utf8\", -1, \"bar\", -1)");
    abort();
  }
  bVar1 = bson_append_int32(uVar2,"int32",0xffffffff,0x4d2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x75,"test_bson_as_json_x1000","bson_append_int32 (b, \"int32\", -1, 1234)");
    abort();
  }
  bVar1 = bson_append_int64(uVar2,"int64",0xffffffff,0x10e1);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x76,"test_bson_as_json_x1000","bson_append_int64 (b, \"int64\", -1, 4321)");
    abort();
  }
  bVar1 = bson_append_double(0x405ed9999999999a,uVar2,"double",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x77,"test_bson_as_json_x1000","bson_append_double (b, \"double\", -1, 123.4)");
    abort();
  }
  bVar1 = bson_append_undefined(uVar2,"undefined",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x78,"test_bson_as_json_x1000","bson_append_undefined (b, \"undefined\", -1)");
    abort();
  }
  bVar1 = bson_append_null(uVar2,"null",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x79,"test_bson_as_json_x1000","bson_append_null (b, \"null\", -1)");
    abort();
  }
  bVar1 = bson_append_oid(uVar2,"oid",0xffffffff,(undefined1 *)((long)&decimal128.high + 4));
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x7a,"test_bson_as_json_x1000","bson_append_oid (b, \"oid\", -1, &oid)");
    abort();
  }
  bVar1 = bson_append_bool(uVar2,"true",0xffffffff,1);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x7b,"test_bson_as_json_x1000","bson_append_bool (b, \"true\", -1, true)");
    abort();
  }
  bVar1 = bson_append_bool(uVar2,"false",0xffffffff,0);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x7c,"test_bson_as_json_x1000","bson_append_bool (b, \"false\", -1, false)");
    abort();
  }
  tVar3 = time((time_t *)0x0);
  bVar1 = bson_append_time_t(uVar2,"date",0xffffffff,tVar3);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x7d,"test_bson_as_json_x1000","bson_append_time_t (b, \"date\", -1, time (NULL))");
    abort();
  }
  uVar4 = time((time_t *)0x0);
  bVar1 = bson_append_timestamp(uVar2,"timestamp",0xffffffff,uVar4 & 0xffffffff,0x4d2);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x7f,"test_bson_as_json_x1000",
            "bson_append_timestamp (b, \"timestamp\", -1, (uint32_t) time (NULL), 1234)");
    abort();
  }
  bVar1 = bson_append_regex(uVar2,"regex",0xffffffff,"^abcd","xi");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x80,"test_bson_as_json_x1000","bson_append_regex (b, \"regex\", -1, \"^abcd\", \"xi\")"
           );
    abort();
  }
  bVar1 = bson_append_dbpointer
                    (uVar2,"dbpointer",0xffffffff,"mycollection",
                     (undefined1 *)((long)&decimal128.high + 4));
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x82,"test_bson_as_json_x1000",
            "bson_append_dbpointer (b, \"dbpointer\", -1, \"mycollection\", &oid)");
    abort();
  }
  bVar1 = bson_append_minkey(uVar2,"minkey",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x83,"test_bson_as_json_x1000","bson_append_minkey (b, \"minkey\", -1)");
    abort();
  }
  bVar1 = bson_append_maxkey(uVar2,"maxkey",0xffffffff);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x84,"test_bson_as_json_x1000","bson_append_maxkey (b, \"maxkey\", -1)");
    abort();
  }
  bVar1 = bson_append_symbol(uVar2,"symbol",0xffffffff,"var a = {};");
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x85,"test_bson_as_json_x1000",
            "bson_append_symbol (b, \"symbol\", -1, \"var a = {};\", -1)");
    abort();
  }
  bVar1 = bson_append_decimal128(uVar2,"decimal128",0xffffffff,&b);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x86,"test_bson_as_json_x1000",
            "bson_append_decimal128 (b, \"decimal128\", -1, &decimal128)");
    abort();
  }
  uVar5 = bson_new();
  bVar1 = bson_append_int32(uVar5,"0",0xffffffff,0x3c);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x89,"test_bson_as_json_x1000","bson_append_int32 (b2, \"0\", -1, 60)");
    abort();
  }
  bVar1 = bson_append_document(uVar2,"document",0xffffffff,uVar5);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8a,"test_bson_as_json_x1000","bson_append_document (b, \"document\", -1, b2)");
    abort();
  }
  bVar1 = bson_append_array(uVar2,"array",0xffffffff,uVar5);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x8b,"test_bson_as_json_x1000","bson_append_array (b, \"array\", -1, b2)");
    abort();
  }
  local_51 = 0x3020100;
  local_4d = 4;
  bVar1 = bson_append_binary(uVar2,"binary",0xffffffff,0,&local_51,5);
  if ((bVar1 & 1) == 0) {
    fprintf(_stderr,"%s:%d %s(): precondition failed: %s\n",
            "/workspace/llm4binary/github/license_c_cmakelists/mongodb[P]libbson/tests/test-json.c",
            0x90,"test_bson_as_json_x1000",
            "bson_append_binary ( b, \"binary\", -1, BSON_SUBTYPE_BINARY, binary, sizeof binary)");
    abort();
  }
  uStack_4c = '\0';
  uStack_4b = '\0';
  uStack_4a = '\0';
  binary[0] = '\0';
  for (; _uStack_4c < 1000; _uStack_4c = _uStack_4c + 1) {
    uVar6 = bson_as_json(uVar2,binary + 1);
    bson_free(uVar6);
  }
  bson_destroy(uVar2);
  bson_destroy(uVar5);
  return;
}

Assistant:

static void
test_bson_as_json_x1000 (void)
{
   bson_oid_t oid;
   bson_decimal128_t decimal128;
   bson_t *b;
   bson_t *b2;
   char *str;
   size_t len;
   int i;

   decimal128.high = 0x3040000000000000ULL;
   decimal128.low = 0x000000000000000B;
   bson_oid_init_from_string (&oid, "123412341234abcdabcdabcd");

   b = bson_new ();
   BSON_ASSERT (bson_append_utf8 (b, "utf8", -1, "bar", -1));
   BSON_ASSERT (bson_append_int32 (b, "int32", -1, 1234));
   BSON_ASSERT (bson_append_int64 (b, "int64", -1, 4321));
   BSON_ASSERT (bson_append_double (b, "double", -1, 123.4));
   BSON_ASSERT (bson_append_undefined (b, "undefined", -1));
   BSON_ASSERT (bson_append_null (b, "null", -1));
   BSON_ASSERT (bson_append_oid (b, "oid", -1, &oid));
   BSON_ASSERT (bson_append_bool (b, "true", -1, true));
   BSON_ASSERT (bson_append_bool (b, "false", -1, false));
   BSON_ASSERT (bson_append_time_t (b, "date", -1, time (NULL)));
   BSON_ASSERT (
      bson_append_timestamp (b, "timestamp", -1, (uint32_t) time (NULL), 1234));
   BSON_ASSERT (bson_append_regex (b, "regex", -1, "^abcd", "xi"));
   BSON_ASSERT (
      bson_append_dbpointer (b, "dbpointer", -1, "mycollection", &oid));
   BSON_ASSERT (bson_append_minkey (b, "minkey", -1));
   BSON_ASSERT (bson_append_maxkey (b, "maxkey", -1));
   BSON_ASSERT (bson_append_symbol (b, "symbol", -1, "var a = {};", -1));
   BSON_ASSERT (bson_append_decimal128 (b, "decimal128", -1, &decimal128));

   b2 = bson_new ();
   BSON_ASSERT (bson_append_int32 (b2, "0", -1, 60));
   BSON_ASSERT (bson_append_document (b, "document", -1, b2));
   BSON_ASSERT (bson_append_array (b, "array", -1, b2));

   {
      const uint8_t binary[] = {0, 1, 2, 3, 4};
      BSON_ASSERT (bson_append_binary (
         b, "binary", -1, BSON_SUBTYPE_BINARY, binary, sizeof binary));
   }

   for (i = 0; i < 1000; i++) {
      str = bson_as_json (b, &len);
      bson_free (str);
   }

   bson_destroy (b);
   bson_destroy (b2);
}